

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O1

void __thiscall mat<3UL,_3UL>::set_col(mat<3UL,_3UL> *this,size_t idx,vec<3UL,_double> *v)

{
  long lVar1;
  double *pdVar2;
  size_t i;
  bool bVar3;
  double dVar4;
  
  if (2 < idx) {
    __assert_fail("idx >= 0 && idx < ncols",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cdgiessen[P]TinyRenderer/ext/geometry.h"
                  ,0xbe,
                  "void mat<3, 3>::set_col(const size_t, const vec<nrows, double> &) [nrows = 3, ncols = 3]"
                 );
  }
  lVar1 = (ulong)(idx != 1) * 8 + 8;
  if (idx == 0) {
    lVar1 = 0;
  }
  pdVar2 = (double *)((long)&this->rows[2].x + lVar1);
  i = 2;
  do {
    dVar4 = vec<3UL,_double>::operator[](v,i);
    if (2 < idx) {
      __assert_fail("i >= 0 && i < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cdgiessen[P]TinyRenderer/ext/geometry.h"
                    ,0x8c,"T &vec<3>::operator[](const size_t) [n = 3, T = double]");
    }
    *pdVar2 = dVar4;
    pdVar2 = pdVar2 + -3;
    bVar3 = i != 0;
    i = i - 1;
  } while (bVar3);
  return;
}

Assistant:

void set_col(const size_t idx, const vec<nrows, double>& v)
    {
        assert(idx >= 0 && idx < ncols);
        for (size_t i = nrows; i--; rows[i][idx] = v[i])
            ;
    }